

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DataTypeApplyOpFromText
               (char *buf,char *initial_value_buf,ImGuiDataType data_type,void *p_data,char *format)

{
  bool bVar1;
  int iVar2;
  double *in_RCX;
  ImGuiDataType in_EDX;
  undefined8 in_RSI;
  char *in_RDI;
  char *in_R8;
  int v32;
  double arg1f_2;
  double arg0f_1;
  double *v_2;
  float arg1f_1;
  float arg0f;
  float *v_1;
  float arg1f;
  int arg0i;
  int *v;
  int arg1i;
  ImGuiDataTypeInfo *type_info;
  int data_backup [2];
  char op;
  int local_8c;
  double local_88;
  double local_80;
  double *local_78;
  float local_70;
  float local_6c;
  double *local_68;
  float local_60;
  float local_5c;
  double *local_58;
  float local_4c;
  ImGuiDataTypeInfo *local_48;
  undefined1 local_3c [11];
  char local_31;
  char *local_30;
  double *local_28;
  ImGuiDataType local_1c;
  undefined8 local_18;
  char *local_10;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while (bVar1 = ImCharIsBlankA(*local_10), bVar1) {
    local_10 = local_10 + 1;
  }
  local_31 = *local_10;
  if (((local_31 == '+') || (local_31 == '*')) || (local_31 == '/')) {
    do {
      local_10 = local_10 + 1;
      bVar1 = ImCharIsBlankA(*local_10);
    } while (bVar1);
  }
  else {
    local_31 = '\0';
  }
  if (*local_10 != '\0') {
    local_48 = DataTypeGetInfo(local_1c);
    memcpy(local_3c,local_28,local_48->Size);
    if (local_30 == (char *)0x0) {
      local_30 = local_48->ScanFmt;
    }
    local_4c = 0.0;
    if (local_1c == 4) {
      local_58 = local_28;
      local_5c = *(float *)local_28;
      local_60 = 0.0;
      if ((local_31 != '\0') && (iVar2 = __isoc99_sscanf(local_18,local_30,&local_5c), iVar2 < 1)) {
        return false;
      }
      if (local_31 == '+') {
        iVar2 = __isoc99_sscanf(local_10,"%d",&local_4c);
        if (iVar2 != 0) {
          *(int *)local_58 = (int)local_5c + (int)local_4c;
        }
      }
      else if (local_31 == '*') {
        iVar2 = __isoc99_sscanf(local_10,"%f",&local_60);
        if (iVar2 != 0) {
          *(int *)local_58 = (int)((float)(int)local_5c * local_60);
        }
      }
      else if (local_31 == '/') {
        iVar2 = __isoc99_sscanf(local_10,"%f",&local_60);
        if ((iVar2 != 0) && ((local_60 != 0.0 || (NAN(local_60))))) {
          *(int *)local_58 = (int)((float)(int)local_5c / local_60);
        }
      }
      else {
        iVar2 = __isoc99_sscanf(local_10,local_30,&local_4c);
        if (iVar2 == 1) {
          *(float *)local_58 = local_4c;
        }
      }
    }
    else if (local_1c == 8) {
      local_30 = "%f";
      local_68 = local_28;
      local_6c = *(float *)local_28;
      local_70 = 0.0;
      if ((local_31 != '\0') && (iVar2 = __isoc99_sscanf(local_18,"%f",&local_6c), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(local_10,local_30,&local_70);
      if (iVar2 < 1) {
        return false;
      }
      if (local_31 == '+') {
        *(float *)local_68 = local_6c + local_70;
      }
      else if (local_31 == '*') {
        *(float *)local_68 = local_6c * local_70;
      }
      else if (local_31 == '/') {
        if ((local_70 != 0.0) || (NAN(local_70))) {
          *(float *)local_68 = local_6c / local_70;
        }
      }
      else {
        *(float *)local_68 = local_70;
      }
    }
    else if (local_1c == 9) {
      local_30 = "%lf";
      local_78 = local_28;
      local_80 = *local_28;
      local_88 = 0.0;
      if ((local_31 != '\0') && (iVar2 = __isoc99_sscanf(local_18,"%lf",&local_80), iVar2 < 1)) {
        return false;
      }
      iVar2 = __isoc99_sscanf(local_10,local_30,&local_88);
      if (iVar2 < 1) {
        return false;
      }
      if (local_31 == '+') {
        *local_78 = local_80 + local_88;
      }
      else if (local_31 == '*') {
        *local_78 = local_80 * local_88;
      }
      else if (local_31 == '/') {
        if ((local_88 != 0.0) || (NAN(local_88))) {
          *local_78 = local_80 / local_88;
        }
      }
      else {
        *local_78 = local_88;
      }
    }
    else if (((local_1c == 5) || (local_1c == 6)) || (local_1c == 7)) {
      __isoc99_sscanf(local_10,local_30,local_28);
    }
    else {
      __isoc99_sscanf(local_10,local_30,&local_8c);
      if (local_1c == 0) {
        iVar2 = ImClamp<int>(local_8c,-0x80,0x7f);
        *(char *)local_28 = (char)iVar2;
      }
      else if (local_1c == 1) {
        iVar2 = ImClamp<int>(local_8c,0,0xff);
        *(char *)local_28 = (char)iVar2;
      }
      else if (local_1c == 2) {
        iVar2 = ImClamp<int>(local_8c,-0x8000,0x7fff);
        *(short *)local_28 = (short)iVar2;
      }
      else if (local_1c == 3) {
        iVar2 = ImClamp<int>(local_8c,0,0xffff);
        *(short *)local_28 = (short)iVar2;
      }
    }
    iVar2 = memcmp(local_3c,local_28,local_48->Size);
    return iVar2 != 0;
  }
  return false;
}

Assistant:

bool ImGui::DataTypeApplyOpFromText(const char* buf, const char* initial_value_buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;

    // We don't support '-' op because it would conflict with inputing negative value.
    // Instead you can use +-100 to subtract from an existing value
    char op = buf[0];
    if (op == '+' || op == '*' || op == '/')
    {
        buf++;
        while (ImCharIsBlankA(*buf))
            buf++;
    }
    else
    {
        op = 0;
    }
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    IM_ASSERT(data_type < ImGuiDataType_COUNT);
    int data_backup[2];
    const ImGuiDataTypeInfo* type_info = ImGui::DataTypeGetInfo(data_type);
    IM_ASSERT(type_info->Size <= sizeof(data_backup));
    memcpy(data_backup, p_data, type_info->Size);

    if (format == NULL)
        format = type_info->ScanFmt;

    // FIXME-LEGACY: The aim is to remove those operators and write a proper expression evaluator at some point..
    int arg1i = 0;
    if (data_type == ImGuiDataType_S32)
    {
        int* v = (int*)p_data;
        int arg0i = *v;
        float arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0i) < 1)
            return false;
        // Store operand in a float so we can use fractional value for multipliers (*1.1), but constant always parsed as integer so we can fit big integers (e.g. 2000000003) past float precision
        if (op == '+')      { if (sscanf(buf, "%d", &arg1i)) *v = (int)(arg0i + arg1i); }                   // Add (use "+-" to subtract)
        else if (op == '*') { if (sscanf(buf, "%f", &arg1f)) *v = (int)(arg0i * arg1f); }                   // Multiply
        else if (op == '/') { if (sscanf(buf, "%f", &arg1f) && arg1f != 0.0f) *v = (int)(arg0i / arg1f); }  // Divide
        else                { if (sscanf(buf, format, &arg1i) == 1) *v = arg1i; }                           // Assign constant
    }
    else if (data_type == ImGuiDataType_Float)
    {
        // For floats we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in
        format = "%f";
        float* v = (float*)p_data;
        float arg0f = *v, arg1f = 0.0f;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_Double)
    {
        format = "%lf"; // scanf differentiate float/double unlike printf which forces everything to double because of ellipsis
        double* v = (double*)p_data;
        double arg0f = *v, arg1f = 0.0;
        if (op && sscanf(initial_value_buf, format, &arg0f) < 1)
            return false;
        if (sscanf(buf, format, &arg1f) < 1)
            return false;
        if (op == '+')      { *v = arg0f + arg1f; }                    // Add (use "+-" to subtract)
        else if (op == '*') { *v = arg0f * arg1f; }                    // Multiply
        else if (op == '/') { if (arg1f != 0.0f) *v = arg0f / arg1f; } // Divide
        else                { *v = arg1f; }                            // Assign constant
    }
    else if (data_type == ImGuiDataType_U32 || data_type == ImGuiDataType_S64 || data_type == ImGuiDataType_U64)
    {
        // All other types assign constant
        // We don't bother handling support for legacy operators since they are a little too crappy. Instead we will later implement a proper expression evaluator in the future.
        sscanf(buf, format, p_data);
    }
    else
    {
        // Small types need a 32-bit buffer to receive the result from scanf()
        int v32;
        sscanf(buf, format, &v32);
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(data_backup, p_data, type_info->Size) != 0;
}